

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::encodeField(JsonCodec *this,Field field,Reader input,Builder output)

{
  Reader input_00;
  Reader *in_RSI;
  Reader *this_00;
  Type TVar1;
  undefined8 *in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff48 [24];
  undefined1 in_stack_ffffffffffffff60 [40];
  Reader local_70;
  
  kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::
  find<capnp::StructSchema::Field&>
            ((HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*> *)
             &stack0xffffffffffffff40,(Field *)&((this->impl).ptr)->fieldHandlers);
  if (in_stack_ffffffffffffff40 == (undefined8 *)0x0) {
    this_00 = (Reader *)&stack0xffffffffffffff48;
    DynamicValue::Reader::Reader(this_00,in_RSI);
    TVar1 = StructSchema::Field::getType(&field);
    input_00.field_1.listValue.reader.ptr = (byte *)in_stack_ffffffffffffff40;
    input_00._0_40_ = input._0_40_;
    input_00.field_1._40_24_ = in_stack_ffffffffffffff48;
    TVar1.field_4.scopeId = TVar1._0_8_;
    TVar1._0_8_ = this_00;
    encode(this,input_00,TVar1,(Builder)in_stack_ffffffffffffff60);
  }
  else {
    in_stack_ffffffffffffff40 = (undefined8 *)*in_stack_ffffffffffffff40;
    this_00 = &local_70;
    DynamicValue::Reader::Reader(this_00,in_RSI);
    (**(code **)*in_stack_ffffffffffffff40)(in_stack_ffffffffffffff40,this,this_00);
  }
  DynamicValue::Reader::~Reader(this_00);
  return;
}

Assistant:

void JsonCodec::encodeField(StructSchema::Field field, DynamicValue::Reader input,
                            JsonValue::Builder output) const {
  KJ_IF_SOME(handler, impl->fieldHandlers.find(field)) {
    handler->encodeBase(*this, input, output);
    return;
  }

  encode(input, field.getType(), output);
}